

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr3r540.cpp
# Opt level: O1

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[1]);
  dVar3 = sin(j[2]);
  dVar4 = cos(j[2]);
  dVar5 = sin(j[1]);
  dVar6 = sin(j[3]);
  dVar7 = cos(j[3]);
  dVar8 = sin(*j);
  dVar9 = sin(j[4]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar24 = dVar2 * dVar4;
  dVar4 = dVar4 * dVar5;
  dVar16 = dVar2 * dVar3;
  dVar3 = dVar3 * dVar5;
  dVar13 = dVar1 * dVar24 - dVar3 * dVar1;
  dVar14 = -dVar4 - dVar16;
  dVar18 = dVar14 * dVar8;
  dVar20 = dVar1 * dVar7 - dVar6 * dVar18;
  dVar21 = dVar1 * 0.26;
  dVar23 = dVar8 * 0.26;
  dVar19 = dVar1 * dVar14;
  dVar22 = dVar19 * dVar6 + dVar8 * dVar7;
  dVar15 = dVar3 - dVar24;
  *eerot = (dVar7 * dVar19 - dVar6 * dVar8) * dVar9 + dVar13 * dVar10;
  dVar13 = dVar13 * dVar9;
  dVar17 = (dVar6 * dVar8 - dVar7 * dVar19) * dVar10;
  eerot[1] = dVar12 * dVar22 + (-dVar13 - dVar17) * dVar11;
  eerot[2] = (dVar17 + dVar13) * dVar12 + dVar22 * dVar11;
  dVar13 = dVar1 * 0.02;
  dVar22 = dVar8 * 0.075;
  dVar17 = dVar1 * 0.075;
  *eetrans = dVar21 * dVar24 +
             (dVar17 * dVar24 - dVar17 * dVar3) * dVar10 +
             (dVar19 * dVar7 * 0.075 - dVar22 * dVar6) * dVar9 +
             dVar2 * dVar21 + ((dVar13 * dVar16 + dVar13 * dVar4) - dVar21 * dVar3) + dVar13;
  dVar13 = dVar24 * dVar8 - dVar3 * dVar8;
  dVar19 = -dVar1 * dVar6 - dVar7 * dVar18;
  eerot[3] = (dVar3 * dVar8 - dVar24 * dVar8) * dVar10 + dVar9 * dVar19;
  eerot[4] = dVar12 * dVar20 + (dVar19 * dVar10 + dVar13 * dVar9) * dVar11;
  eerot[5] = (-dVar9 * dVar13 - (-(dVar7 * dVar18) - dVar1 * dVar6) * dVar10) * dVar12 +
             dVar20 * dVar11;
  dVar8 = dVar8 * 0.02;
  eetrans[1] = dVar23 * dVar3 +
               ((((((-dVar17 * dVar6 - dVar18 * dVar7 * 0.075) * dVar9 +
                   ((dVar3 * dVar22 - dVar22 * dVar24) * dVar10 - dVar2 * dVar23)) - dVar23 * dVar24
                  ) - dVar4 * dVar8) - dVar16 * dVar8) - dVar8);
  eerot[6] = dVar15 * dVar7 * dVar9 + dVar14 * dVar10;
  dVar1 = dVar15 * dVar7 * dVar10;
  eerot[7] = dVar12 * dVar15 * dVar6 + (dVar9 * (dVar16 + dVar4) + dVar1) * dVar11;
  eerot[8] = ((dVar16 + dVar4) * -dVar9 - dVar1) * dVar12 + dVar15 * dVar6 * dVar11;
  eetrans[2] = (dVar24 * -0.075 + dVar3 * 0.075) * dVar7 * dVar9 +
               dVar3 * -0.02 +
               dVar24 * 0.02 +
               dVar4 * -0.26 +
               dVar16 * -0.26 + dVar5 * -0.26 + (dVar16 * -0.075 + dVar4 * -0.075) * dVar10 + 0.345;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.26)*x0);
x13=((1.0)*x6);
x14=((0.075)*x0);
x15=((0.02)*x7);
x16=((0.075)*x7);
x17=((1.0)*x7);
x18=((0.02)*x0);
x19=((1.0)*x0);
x20=((0.26)*x7);
x21=((0.075)*x6);
x22=(x0*x5);
x23=(x2*x4);
x24=(x1*x3);
x25=((-1.0)*x9);
x26=((-1.0)*x8);
x27=(x6*x8);
x28=(x3*x4);
x29=(x1*x2);
x30=(x17*x5);
x31=(x0*x13);
x32=(x17*x23);
x33=((((-1.0)*x24))+x23);
x34=(x28+x29);
x35=(x33*x5);
x36=(x33*x6);
x37=(((x0*x24))+(((-1.0)*x19*x23)));
x38=((((-1.0)*x32))+((x24*x7)));
x39=(x36*x9);
x40=(x19*(((((-1.0)*x28))+(((-1.0)*x29)))));
x41=(x17*(((((-1.0)*x28))+(((-1.0)*x29)))));
x42=(x37*x8);
x43=(x41*x5);
x44=(x41*x6);
x45=((-1.0)*x41);
x46=(((x40*x5))+((x6*x7)));
x47=(x30+(((-1.0)*x13*x40)));
x48=((((-1.0)*x19*x5))+(((-1.0)*x13*x41)));
x49=(x47*x9);
eerot[0]=(((x8*(((((-1.0)*x30))+((x40*x6))))))+((x37*x9)));
eerot[1]=(((x11*x46))+((x10*(((((-1.0)*x42))+(((-1.0)*x49)))))));
eerot[2]=(((x11*((x49+x42))))+((x10*x46)));
IkReal x50=((1.0)*x23);
eetrans[0]=(((x18*x29))+((x18*x28))+(((-1.0)*x12*x50))+((x1*x12))+((x8*(((((-1.0)*x16*x5))+((x21*x40))))))+((x9*(((((-1.0)*x14*x50))+((x14*x24))))))+x18+((x12*x24)));
eerot[3]=(((x9*(((((-1.0)*x17*x24))+x32))))+((x48*x8)));
eerot[4]=(((x11*(((((-1.0)*x43))+x31))))+((x10*((((x48*x9))+((x38*x8)))))));
eerot[5]=(((x11*((((x26*x38))+((x25*(((((-1.0)*x44))+(((-1.0)*x22))))))))))+((x10*(((((-1.0)*x43))+x31)))));
IkReal x51=((1.0)*x15);
IkReal x52=((1.0)*x24);
eetrans[1]=((((-1.0)*x1*x20))+((x9*(((((-1.0)*x16*x52))+((x16*x23))))))+((x8*(((((-1.0)*x14*x5))+(((-1.0)*x21*x41))))))+(((-1.0)*x20*x52))+(((-1.0)*x28*x51))+(((-1.0)*x29*x51))+(((-1.0)*x51))+((x20*x23)));
eerot[6]=(((x27*x33))+((x9*(((((-1.0)*x28))+(((-1.0)*x29)))))));
eerot[7]=(((x11*x35))+((x10*((((x34*x8))+x39)))));
eerot[8]=(((x11*((((x26*x34))+((x25*x36))))))+((x10*x35)));
eetrans[2]=((0.345)+((x9*(((((-0.075)*x29))+(((-0.075)*x28))))))+(((-0.26)*x4))+(((-0.26)*x29))+(((-0.26)*x28))+(((0.02)*x24))+(((-0.02)*x23))+((x27*(((((-0.075)*x24))+(((0.075)*x23)))))));
}